

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O1

void make_level_set3(vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *tri,
                    vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *x,Vec3f *origin,
                    float dx,int ni,int nj,int nk,Array3f *phi,int exact_band)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  unsigned_long uVar12;
  pointer pVVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar30;
  pointer pVVar31;
  float *pfVar32;
  int *piVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  int i;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 in_XMM8_Da;
  undefined4 in_XMM8_Db;
  undefined8 in_XMM8_Qb;
  double local_1c8;
  double local_1c0;
  ulong local_1b8;
  Vec3f local_158;
  double local_148;
  Array3i intersection_count;
  double local_118;
  Array3i closest_tri;
  double local_98;
  double local_68;
  
  Array3<float,_Array1<float>_>::resize(phi,ni,nj,nk);
  uVar12 = (phi->a).n;
  if (uVar12 != 0) {
    fVar48 = (float)(ni + nj + nk) * dx;
    pfVar32 = (phi->a).data;
    auVar45 = vpbroadcastq_avx512vl();
    uVar38 = 0;
    auVar20 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar21 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    do {
      auVar46 = vpbroadcastq_avx512vl();
      auVar47 = vpor_avx2(auVar46,auVar20);
      auVar46 = vpor_avx2(auVar46,auVar21);
      uVar22 = vpcmpuq_avx512vl(auVar46,auVar45,2);
      bVar26 = (byte)uVar22;
      uVar22 = vpcmpuq_avx512vl(auVar47,auVar45,2);
      bVar23 = (byte)uVar22 << 4;
      pauVar1 = (undefined1 (*) [32])(pfVar32 + uVar38);
      auVar47._0_4_ =
           (uint)(bVar26 & 1) * (int)fVar48 | (uint)!(bool)(bVar26 & 1) * *(int *)*pauVar1;
      bVar43 = (bool)((bVar26 & 2) >> 1);
      auVar47._4_4_ = (uint)bVar43 * (int)fVar48 | (uint)!bVar43 * *(int *)(*pauVar1 + 4);
      bVar43 = (bool)((bVar26 & 4) >> 2);
      auVar47._8_4_ = (uint)bVar43 * (int)fVar48 | (uint)!bVar43 * *(int *)(*pauVar1 + 8);
      bVar43 = (bool)((bVar26 & 0xf) >> 3);
      auVar47._12_4_ = (uint)bVar43 * (int)fVar48 | (uint)!bVar43 * *(int *)(*pauVar1 + 0xc);
      bVar43 = (bool)((byte)uVar22 & 1);
      auVar47._16_4_ = (uint)bVar43 * (int)fVar48 | (uint)!bVar43 * *(int *)(*pauVar1 + 0x10);
      bVar43 = (bool)(bVar23 >> 5 & 1);
      auVar47._20_4_ = (uint)bVar43 * (int)fVar48 | (uint)!bVar43 * *(int *)(*pauVar1 + 0x14);
      bVar43 = (bool)(bVar23 >> 6 & 1);
      auVar47._24_4_ = (uint)bVar43 * (int)fVar48 | (uint)!bVar43 * *(int *)(*pauVar1 + 0x18);
      auVar47._28_4_ =
           (uint)(bVar23 >> 7) * (int)fVar48 |
           (uint)!(bool)(bVar23 >> 7) * *(int *)(*pauVar1 + 0x1c);
      *pauVar1 = auVar47;
      uVar38 = uVar38 + 8;
    } while ((uVar12 + 7 & 0xfffffffffffffff8) != uVar38);
  }
  intersection_count.ni = -1;
  Array3<int,_Array1<int>_>::Array3(&closest_tri,ni,nj,nk,&intersection_count.ni);
  local_158.v._0_8_ = (ulong)(uint)local_158.v[1] << 0x20;
  Array3<int,_Array1<int>_>::Array3(&intersection_count,ni,nj,nk,(int *)&local_158);
  pVVar31 = (tri->super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((tri->super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar31) {
    dVar55 = (double)dx;
    iVar34 = ni + -1;
    iVar41 = nj + -1;
    iVar35 = nk + -1;
    local_1b8 = 0;
    do {
      uVar42 = pVVar31[local_1b8].v[0];
      uVar10 = pVVar31[local_1b8].v[1];
      uVar11 = pVVar31[local_1b8].v[2];
      pVVar13 = (x->super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      auVar56._0_8_ = (double)origin->v[0];
      auVar69._0_8_ = ((double)pVVar13[uVar42].v[0] - auVar56._0_8_) / dVar55;
      auVar69._8_8_ = 0;
      auVar44 = vinsertps_avx(ZEXT416((uint)pVVar13[uVar10].v[2]),
                              ZEXT416((uint)pVVar13[uVar42].v[2]),0x10);
      auVar44 = vcvtps2pd_avx(auVar44);
      auVar14 = vinsertps_avx(ZEXT416((uint)pVVar13[uVar11].v[0]),
                              ZEXT416((uint)pVVar13[uVar10].v[0]),0x10);
      auVar14 = vcvtps2pd_avx(auVar14);
      auVar56._8_8_ = auVar56._0_8_;
      auVar14 = vsubpd_avx(auVar14,auVar56);
      auVar16._8_8_ = dVar55;
      auVar16._0_8_ = dVar55;
      auVar14 = vdivpd_avx(auVar14,auVar16);
      auVar15 = vshufpd_avx(auVar14,auVar14,1);
      auVar56 = vminsd_avx(auVar14,auVar15);
      auVar56 = vminsd_avx(auVar56,auVar69);
      iVar36 = (int)auVar56._0_8_ - exact_band;
      iVar39 = iVar34;
      if (iVar36 < iVar34) {
        iVar39 = iVar36;
      }
      iVar40 = 0;
      if (iVar36 < 0) {
        iVar39 = iVar40;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(origin->v + 1);
      auVar56 = vcvtps2pd_avx(auVar2);
      auVar70._0_8_ = ((double)pVVar13[uVar42].v[1] - auVar56._0_8_) / dVar55;
      auVar70._8_8_ = 0;
      auVar65._0_8_ = ((double)pVVar13[uVar10].v[1] - auVar56._0_8_) / dVar55;
      auVar65._8_8_ = 0;
      auVar2 = vshufpd_avx(auVar56,auVar56,3);
      auVar44 = vsubpd_avx(auVar44,auVar2);
      auVar2 = vdivpd_avx(auVar44,auVar16);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(pVVar13[uVar11].v + 1);
      auVar44 = vcvtps2pd_avx(auVar44);
      auVar44 = vsubpd_avx(auVar44,auVar56);
      auVar44 = vdivpd_avx(auVar44,auVar16);
      auVar56 = vunpcklpd_avx(auVar65,auVar2);
      auVar56 = vminpd_avx(auVar44,auVar56);
      auVar16 = vshufpd_avx(auVar2,auVar2,1);
      auVar61._8_8_ = auVar2._8_8_;
      auVar61._0_8_ = auVar70._0_8_;
      auVar56 = vminpd_avx(auVar56,auVar61);
      iVar28 = (int)auVar56._0_8_ - exact_band;
      iVar36 = iVar41;
      if (iVar28 < iVar41) {
        iVar36 = iVar28;
      }
      if (iVar28 < 0) {
        iVar36 = iVar40;
      }
      auVar61 = vmaxsd_avx(auVar44,auVar65);
      auVar17 = vshufpd_avx(auVar56,auVar56,1);
      auVar61 = vmaxsd_avx(auVar61,auVar70);
      iVar29 = (int)auVar17._0_8_ - exact_band;
      iVar28 = iVar35;
      if (iVar29 < iVar35) {
        iVar28 = iVar29;
      }
      if (iVar29 < 0) {
        iVar28 = 0;
      }
      auVar18 = vshufpd_avx(auVar44,auVar44,1);
      auVar17 = vmaxsd_avx(auVar18,auVar2);
      auVar16 = vmaxsd_avx(auVar17,auVar16);
      local_148 = auVar16._0_8_;
      iVar29 = (int)local_148 + exact_band + 1;
      if (iVar35 <= iVar29) {
        iVar29 = iVar35;
      }
      if ((int)local_148 + exact_band < -1) {
        iVar29 = iVar40;
      }
      local_118 = auVar15._0_8_;
      if (iVar28 <= iVar29) {
        iVar30 = (int)auVar61._0_8_;
        iVar40 = iVar30 + exact_band + 1;
        if (iVar41 <= iVar40) {
          iVar40 = iVar41;
        }
        if (iVar30 + exact_band < -1) {
          iVar40 = 0;
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_118;
        auVar15 = vmaxsd_avx(auVar14,auVar15);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auVar69._0_8_;
        auVar15 = vmaxsd_avx(auVar15,auVar17);
        iVar30 = (int)auVar15._0_8_ + exact_band + 1;
        if (iVar34 <= iVar30) {
          iVar30 = iVar34;
        }
        if ((int)auVar15._0_8_ + exact_band < -1) {
          iVar30 = 0;
        }
        do {
          if (iVar36 <= iVar40) {
            iVar37 = iVar36;
            do {
              if (iVar39 <= iVar30) {
                i = iVar39;
                do {
                  auVar51._0_4_ = (float)i;
                  auVar51._8_8_ = in_XMM8_Qb;
                  auVar51._4_4_ = in_XMM8_Db;
                  auVar15 = vinsertps_avx(auVar51,ZEXT416((uint)(float)iVar37),0x10);
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)origin->v[2]),ZEXT416((uint)(float)iVar28)
                                            ,ZEXT416((uint)dx));
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = *(ulong *)origin->v;
                  auVar27._4_4_ = dx;
                  auVar27._0_4_ = dx;
                  auVar27._8_4_ = dx;
                  auVar27._12_4_ = dx;
                  auVar15 = vfmadd231ps_fma(auVar62,auVar15,auVar27);
                  local_158.v._0_8_ = vmovlps_avx(auVar15);
                  local_158.v[2] = auVar16._0_4_;
                  pVVar13 = (x->super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  fVar48 = point_triangle_distance
                                     (&local_158,pVVar13 + uVar42,pVVar13 + uVar10,pVVar13 + uVar11)
                  ;
                  pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,i,iVar37,iVar28);
                  if (fVar48 < *pfVar32) {
                    pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,i,iVar37,iVar28);
                    *pfVar32 = fVar48;
                    piVar33 = Array3<int,_Array1<int>_>::operator()(&closest_tri,i,iVar37,iVar28);
                    *piVar33 = (int)local_1b8;
                  }
                  i = i + 1;
                } while (iVar30 + 1 != i);
              }
              bVar43 = iVar37 != iVar40;
              iVar37 = iVar37 + 1;
            } while (bVar43);
          }
          bVar43 = iVar28 != iVar29;
          iVar28 = iVar28 + 1;
        } while (bVar43);
      }
      auVar56 = vroundpd_avx(auVar56,10);
      auVar52._0_4_ = (int)auVar56._0_8_;
      auVar52._4_4_ = (int)auVar56._8_8_;
      auVar52._8_8_ = 0;
      iVar39 = auVar52._0_4_;
      if (iVar41 <= auVar52._0_4_) {
        iVar39 = iVar41;
      }
      uVar38 = vpmovd2m_avx512vl(auVar52);
      if ((uVar38 & 1) != 0) {
        iVar39 = 0;
      }
      iVar36 = auVar52._4_4_;
      if (iVar35 <= auVar52._4_4_) {
        iVar36 = iVar35;
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_148;
      auVar24._4_4_ = in_XMM8_Db;
      auVar24._0_4_ = in_XMM8_Da;
      auVar24._8_8_ = in_XMM8_Qb;
      auVar56 = vroundsd_avx(auVar24,auVar3,9);
      iVar40 = (int)auVar56._0_8_;
      if ((uVar38 & 2) != 0) {
        iVar36 = 0;
      }
      iVar28 = iVar35;
      if (iVar40 < iVar35) {
        iVar28 = iVar40;
      }
      if (iVar40 < 0) {
        iVar28 = 0;
      }
      if (iVar36 <= iVar28) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar61._0_8_;
        auVar25._4_4_ = in_XMM8_Db;
        auVar25._0_4_ = in_XMM8_Da;
        auVar25._8_8_ = in_XMM8_Qb;
        auVar56 = vroundsd_avx(auVar25,auVar4,9);
        iVar29 = (int)auVar56._0_8_;
        iVar40 = iVar41;
        if (iVar29 < iVar41) {
          iVar40 = iVar29;
        }
        if (iVar29 < 0) {
          iVar40 = 0;
        }
        do {
          if (iVar39 <= iVar40) {
            dVar49 = (double)iVar36;
            auVar57._8_8_ = dVar49;
            auVar57._0_8_ = dVar49;
            auVar56 = vsubpd_avx(auVar2,auVar57);
            local_98 = auVar18._0_8_;
            local_98 = local_98 - dVar49;
            dVar60 = auVar56._0_8_;
            auVar56 = vshufpd_avx(auVar56,auVar56,1);
            dVar49 = auVar56._0_8_;
            iVar29 = iVar39;
            do {
              dVar64 = (double)iVar29;
              dVar19 = auVar65._0_8_ - dVar64;
              local_68 = auVar44._0_8_;
              local_68 = local_68 - dVar64;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = dVar60;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = dVar19 * local_98;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = local_68;
              auVar54 = vfmsub231sd_fma(auVar53,auVar63,auVar5);
              dVar50 = auVar54._0_8_;
              iVar30 = 1;
              if (dVar50 <= 0.0) {
                if (dVar50 < 0.0) {
                  iVar30 = -1;
                }
                else {
                  iVar30 = (uint)(dVar60 < local_98) * 2 + -1;
                  if ((local_98 == dVar60) && (iVar30 = 1, dVar19 <= local_68)) {
                    iVar30 = -(uint)(dVar19 < local_68);
                  }
                }
              }
              if (iVar30 == 0) {
LAB_001055c6:
                bVar43 = false;
              }
              else {
                dVar64 = auVar70._0_8_ - dVar64;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = local_98;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = dVar64;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = local_68 * dVar49;
                auVar56 = vfmsub231sd_fma(auVar67,auVar66,auVar6);
                local_1c0 = auVar56._0_8_;
                iVar37 = 1;
                if (local_1c0 <= 0.0) {
                  if (local_1c0 < 0.0) {
                    iVar37 = -1;
                  }
                  else {
                    iVar37 = (uint)(local_98 < dVar49) * 2 + -1;
                    if ((dVar49 == local_98) && (iVar37 = 1, local_68 <= dVar64)) {
                      iVar37 = -(uint)(local_68 < dVar64);
                    }
                  }
                }
                if (iVar37 != iVar30) goto LAB_001055c6;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = dVar49;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = dVar19;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = dVar64 * dVar60;
                auVar56 = vfmsub231sd_fma(auVar68,auVar58,auVar7);
                local_1c8 = auVar56._0_8_;
                iVar37 = 1;
                if (local_1c8 <= 0.0) {
                  if (local_1c8 < 0.0) {
                    iVar37 = -1;
                  }
                  else {
                    iVar37 = (uint)(dVar49 < dVar60) * 2 + -1;
                    if ((dVar60 == dVar49) && (iVar37 = 1, dVar64 <= dVar19)) {
                      iVar37 = -(uint)(dVar64 < dVar19);
                    }
                  }
                }
                bVar43 = iVar37 == iVar30;
                if (bVar43) {
                  dVar19 = local_1c8 + dVar50 + local_1c0;
                  if ((dVar19 == 0.0) && (!NAN(dVar19))) {
                    __assert_fail("sum!=0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alecjacobson[P]SDFGen/makelevelset3.cpp"
                                  ,0x6f,
                                  "bool point_in_triangle_2d(double, double, double, double, double, double, double, double, double &, double &, double &)"
                                 );
                  }
                  uVar22 = auVar54._8_8_;
                  auVar54._0_8_ = dVar50 / dVar19;
                  auVar54._8_8_ = uVar22;
                  local_1c0 = local_1c0 / dVar19;
                  local_1c8 = local_1c8 / dVar19;
                  bVar43 = true;
                }
              }
              if (bVar43) {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = auVar69._0_8_;
                auVar59._8_8_ = 0;
                auVar59._0_8_ = local_118 * local_1c0;
                auVar56 = vfmadd132sd_fma(auVar54,auVar59,auVar8);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = local_1c8;
                auVar56 = vfmadd231sd_fma(auVar56,auVar14,auVar9);
                auVar56 = vroundsd_avx(auVar56,auVar56,10);
                iVar30 = (int)auVar56._0_8_;
                if (iVar30 < 0) {
                  iVar30 = 0;
                }
                else if (ni <= iVar30) goto LAB_001056bd;
                piVar33 = Array3<int,_Array1<int>_>::operator()
                                    (&intersection_count,iVar30,iVar29,iVar36);
                *piVar33 = *piVar33 + 1;
              }
LAB_001056bd:
              iVar29 = iVar29 + 1;
            } while (iVar40 + 1 != iVar29);
          }
          bVar43 = iVar36 != iVar28;
          iVar36 = iVar36 + 1;
        } while (bVar43);
      }
      local_1b8 = (ulong)((int)local_1b8 + 1);
      pVVar31 = (tri->
                super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar38 = ((long)(tri->
                      super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar31 >> 2) *
               -0x5555555555555555;
    } while (local_1b8 <= uVar38 && uVar38 - local_1b8 != 0);
  }
  iVar34 = 1;
  do {
    sweep(tri,x,phi,&closest_tri,origin,dx,1,1,1);
    sweep(tri,x,phi,&closest_tri,origin,dx,-1,-1,-1);
    sweep(tri,x,phi,&closest_tri,origin,dx,1,1,-1);
    sweep(tri,x,phi,&closest_tri,origin,dx,-1,-1,1);
    sweep(tri,x,phi,&closest_tri,origin,dx,1,-1,1);
    sweep(tri,x,phi,&closest_tri,origin,dx,-1,1,-1);
    sweep(tri,x,phi,&closest_tri,origin,dx,1,-1,-1);
    sweep(tri,x,phi,&closest_tri,origin,dx,-1,1,1);
    iVar34 = iVar34 + -1;
  } while (iVar34 == 0);
  if (0 < nk) {
    iVar34 = 0;
    do {
      if (0 < nj) {
        iVar35 = 0;
        do {
          if (0 < ni) {
            iVar41 = 0;
            uVar42 = 0;
            do {
              piVar33 = Array3<int,_Array1<int>_>::operator()
                                  (&intersection_count,iVar41,iVar35,iVar34);
              uVar42 = uVar42 + *piVar33;
              if ((uVar42 & 0x80000001) == 1) {
                pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,iVar41,iVar35,iVar34);
                fVar48 = *pfVar32;
                pfVar32 = Array3<float,_Array1<float>_>::operator()(phi,iVar41,iVar35,iVar34);
                auVar14._8_4_ = 0x80000000;
                auVar14._0_8_ = 0x8000000080000000;
                auVar14._12_4_ = 0x80000000;
                auVar44 = vxorps_avx512vl(ZEXT416((uint)fVar48),auVar14);
                *pfVar32 = auVar44._0_4_;
              }
              iVar41 = iVar41 + 1;
            } while (ni != iVar41);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != nj);
      }
      iVar34 = iVar34 + 1;
    } while (iVar34 != nk);
  }
  intersection_count.ni = 0;
  intersection_count.nj = 0;
  free(intersection_count.a.data);
  closest_tri.ni = 0;
  closest_tri.nj = 0;
  free(closest_tri.a.data);
  return;
}

Assistant:

void make_level_set3(const std::vector<Vec3ui> &tri, const std::vector<Vec3f> &x,
                     const Vec3f &origin, float dx, int ni, int nj, int nk,
                     Array3f &phi, const int exact_band)
{
   phi.resize(ni, nj, nk);
   phi.assign((ni+nj+nk)*dx); // upper bound on distance
   Array3i closest_tri(ni, nj, nk, -1);
   Array3i intersection_count(ni, nj, nk, 0); // intersection_count(i,j,k) is # of tri intersections in (i-1,i]x{j}x{k}
   // we begin by initializing distances near the mesh, and figuring out intersection counts
   Vec3f ijkmin, ijkmax;
   for(unsigned int t=0; t<tri.size(); ++t){
     unsigned int p, q, r; assign(tri[t], p, q, r);
     // coordinates in grid to high precision
      double fip=((double)x[p][0]-origin[0])/dx, fjp=((double)x[p][1]-origin[1])/dx, fkp=((double)x[p][2]-origin[2])/dx;
      double fiq=((double)x[q][0]-origin[0])/dx, fjq=((double)x[q][1]-origin[1])/dx, fkq=((double)x[q][2]-origin[2])/dx;
      double fir=((double)x[r][0]-origin[0])/dx, fjr=((double)x[r][1]-origin[1])/dx, fkr=((double)x[r][2]-origin[2])/dx;
      // do distances nearby
      int i0=clamp(int(min(fip,fiq,fir))-exact_band, 0, ni-1), i1=clamp(int(max(fip,fiq,fir))+exact_band+1, 0, ni-1);
      int j0=clamp(int(min(fjp,fjq,fjr))-exact_band, 0, nj-1), j1=clamp(int(max(fjp,fjq,fjr))+exact_band+1, 0, nj-1);
      int k0=clamp(int(min(fkp,fkq,fkr))-exact_band, 0, nk-1), k1=clamp(int(max(fkp,fkq,fkr))+exact_band+1, 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j) for(int i=i0; i<=i1; ++i){
         Vec3f gx(i*dx+origin[0], j*dx+origin[1], k*dx+origin[2]);
         float d=point_triangle_distance(gx, x[p], x[q], x[r]);
         if(d<phi(i,j,k)){
            phi(i,j,k)=d;
            closest_tri(i,j,k)=t;
         }
      }
      // and do intersection counts
      j0=clamp((int)std::ceil(min(fjp,fjq,fjr)), 0, nj-1);
      j1=clamp((int)std::floor(max(fjp,fjq,fjr)), 0, nj-1);
      k0=clamp((int)std::ceil(min(fkp,fkq,fkr)), 0, nk-1);
      k1=clamp((int)std::floor(max(fkp,fkq,fkr)), 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j){
         double a, b, c;
         if(point_in_triangle_2d(j, k, fjp, fkp, fjq, fkq, fjr, fkr, a, b, c)){
            double fi=a*fip+b*fiq+c*fir; // intersection i coordinate
            int i_interval=int(std::ceil(fi)); // intersection is in (i_interval-1,i_interval]
            if(i_interval<0) ++intersection_count(0, j, k); // we enlarge the first interval to include everything to the -x direction
            else if(i_interval<ni) ++intersection_count(i_interval,j,k);
            // we ignore intersections that are beyond the +x side of the grid
         }
      }
   }
   // and now we fill in the rest of the distances with fast sweeping
   for(unsigned int pass=0; pass<2; ++pass){
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, +1);
   }
   // then figure out signs (inside/outside) from intersection counts
   for(int k=0; k<nk; ++k) for(int j=0; j<nj; ++j){
      int total_count=0;
      for(int i=0; i<ni; ++i){
         total_count+=intersection_count(i,j,k);
         if(total_count%2==1){ // if parity of intersections so far is odd,
            phi(i,j,k)=-phi(i,j,k); // we are inside the mesh
         }
      }
   }
}